

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O3

void ut11::Assert::That<std::__cxx11::string,ut11::Operands::EqualTo<char[91]>>
               (size_t line,string *file,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
               EqualTo<char[91]> *operand)

{
  pointer pcVar1;
  int iVar2;
  string local_68;
  string local_48;
  
  iVar2 = std::__cxx11::string::compare((char *)expected);
  if (iVar2 != 0) {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + file->_M_string_length);
    Operands::EqualTo<char[91]>::GetErrorMessage<std::__cxx11::string>(&local_48,operand,expected);
    Fail(line,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}